

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O0

void __thiscall Test::Test(Test *this,char *description,Body *body)

{
  Registry *this_00;
  Test *local_38 [3];
  Body *local_20;
  Body *body_local;
  char *description_local;
  Test *this_local;
  
  this->description = description;
  local_20 = body;
  body_local = (Body *)description;
  description_local = (char *)this;
  std::function<bool_()>::function(&this->body,body);
  this_00 = Registry::getInstance();
  local_38[0] = this;
  std::__cxx11::list<Test_*,_std::allocator<Test_*>_>::push_back(&this_00->tests,local_38);
  return;
}

Assistant:

Test::Test(const char *description, Body body)
	: description(description), body(body)
{
	Registry::getInstance().tests.push_back(this);
}